

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int ParseLocalArrayChunk(void *chunk,ACSLocalArrays *arrays,int offset)

{
  uint uVar1;
  ulong uVar2;
  ACSLocalArrayInfo *pAVar3;
  uint local_34;
  uint i;
  ACSLocalArrayInfo *info;
  int *sizes;
  uint count;
  int offset_local;
  ACSLocalArrays *arrays_local;
  void *chunk_local;
  
  uVar1 = (int)((*(uint *)((long)chunk + 4) & 0xffff) - 2) / 4;
  arrays->Count = uVar1;
  sizes._4_4_ = offset;
  if (uVar1 != 0) {
    uVar2 = SUB168(ZEXT416(uVar1) * ZEXT816(8),0);
    if (SUB168(ZEXT416(uVar1) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pAVar3 = (ACSLocalArrayInfo *)operator_new__(uVar2);
    arrays->Info = pAVar3;
    for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
      pAVar3[local_34].Size = *(uint *)((long)chunk + (ulong)local_34 * 4 + 10);
      pAVar3[local_34].Offset = sizes._4_4_;
      sizes._4_4_ = pAVar3[local_34].Size + sizes._4_4_;
    }
  }
  return sizes._4_4_;
}

Assistant:

static int ParseLocalArrayChunk(void *chunk, ACSLocalArrays *arrays, int offset)
{
	unsigned count = (LittleShort(static_cast<unsigned short>(((unsigned *)chunk)[1]) - 2)) / 4;
	int *sizes = (int *)((BYTE *)chunk + 10);
	arrays->Count = count;
	if (count > 0)
	{
		ACSLocalArrayInfo *info = new ACSLocalArrayInfo[count];
		arrays->Info = info;
		for (unsigned i = 0; i < count; ++i)
		{
			info[i].Size = LittleLong(sizes[i]);
			info[i].Offset = offset;
			offset += info[i].Size;
		}
	}
	// Return the new local variable size, with space for the arrays
	return offset;
}